

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O0

SRes LookInStream_LookRead(ILookInStream *stream,void *buf,size_t *size)

{
  size_t *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  int __result__;
  void *lookBuf;
  void *local_28;
  size_t *local_20;
  void *local_18;
  undefined8 *local_10;
  int local_4;
  
  if (*in_RDX == 0) {
    local_4 = 0;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_4 = (*(code *)*in_RDI)(in_RDI,&local_28,in_RDX);
    if (local_4 == 0) {
      memcpy(local_18,local_28,*local_20);
      local_4 = (*(code *)local_10[1])(local_10,*local_20);
    }
  }
  return local_4;
}

Assistant:

SRes LookInStream_LookRead(ILookInStream *stream, void *buf, size_t *size)
{
  const void *lookBuf;
  if (*size == 0)
    return SZ_OK;
  RINOK(stream->Look(stream, &lookBuf, size));
  memcpy(buf, lookBuf, *size);
  return stream->Skip(stream, *size);
}